

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::keyPressEvent(QAbstractButton *this,QKeyEvent *e)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  QAbstractButtonPrivate *this_00;
  QWidget *pQVar4;
  bool bVar5;
  char cVar6;
  LayoutDirection LVar7;
  long lVar8;
  uint uVar9;
  QWidget *this_01;
  long in_FS_OFFSET;
  QList<Qt::Key> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  iVar3 = *(int *)(e + 0x40);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d._0_4_ = 0xaaaaaaaa;
  local_78.d.d._4_4_ = 0xaaaaaaaa;
  local_78.d.ptr._0_4_ = 0xaaaaaaaa;
  local_78.d.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
            (&local_58,QGuiApplicationPrivate::platform_theme,0x28);
  qvariant_cast<QList<Qt::Key>>(&local_78,&local_58);
  ::QVariant::~QVariant(&local_58);
  if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
    lVar8 = 0;
    do {
      if (local_78.d.size << 2 == lVar8) goto LAB_003beebb;
      lVar1 = lVar8 + 4;
      piVar2 = (int *)(CONCAT44(local_78.d.ptr._4_4_,local_78.d.ptr._0_4_) + lVar8);
      lVar8 = lVar1;
    } while (*piVar2 != iVar3);
    if ((lVar1 != 0) && (-1 < *(short *)(e + 0x50))) {
      setDown(this,true);
      QWidget::repaint(&this->super_QWidget);
      QAbstractButtonPrivate::emitPressed(this_00);
      goto LAB_003bef24;
    }
  }
LAB_003beebb:
  uVar9 = iVar3 + 0xfeffffee;
  if (uVar9 < 4) {
    if ((((this_00->field_0x28c & 8) == 0) && (this_00->group == (QButtonGroup *)0x0)) &&
       ((pQVar4 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10),
        this_01 = &this->super_QWidget, pQVar4 == (QWidget *)0x0 ||
        (lVar8 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject),
        this_01 = pQVar4, lVar8 == 0)))) {
      LVar7 = QWidget::layoutDirection(this_01);
      (**(code **)(*(long *)&this->super_QWidget + 0x198))
                (this,*(int *)(e + 0x40) != (uint)(LVar7 == RightToLeft) * 2 + 0x1000012 &
                      0xdU >> ((byte)uVar9 & 0xf));
      goto LAB_003bef24;
    }
    QAbstractButtonPrivate::moveFocus(this_00,*(int *)(e + 0x40));
    bVar5 = QWidget::hasFocus(&this->super_QWidget);
    if (!bVar5) goto LAB_003bef24;
  }
  else {
    cVar6 = QKeyEvent::matches((StandardKey)e);
    if ((cVar6 != '\0') && ((this_00->field_0x28c & 0x10) != 0)) {
      setDown(this,false);
      QWidget::repaint(&this->super_QWidget);
      QAbstractButtonPrivate::emitReleased(this_00);
      goto LAB_003bef24;
    }
  }
  e[0xc] = (QKeyEvent)0x0;
LAB_003bef24:
  piVar2 = (int *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d.d._4_4_,local_78.d.d._0_4_),4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::keyPressEvent(QKeyEvent *e)
{
    Q_D(QAbstractButton);
    bool next = true;

    const auto key = e->key();
    const auto buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                         ->themeHint(QPlatformTheme::ButtonPressKeys)
                                         .value<QList<Qt::Key>>();
    if (buttonPressKeys.contains(key) && !e->isAutoRepeat()) {
        setDown(true);
        repaint();
        d->emitPressed();
        return;
    }

    switch (key) {
    case Qt::Key_Up:
        next = false;
        Q_FALLTHROUGH();
    case Qt::Key_Left:
    case Qt::Key_Right:
    case Qt::Key_Down: {
#ifdef QT_KEYPAD_NAVIGATION
        if ((QApplicationPrivate::keypadNavigationEnabled()
                && (e->key() == Qt::Key_Left || e->key() == Qt::Key_Right))
                || (!QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional
                || (e->key() == Qt::Key_Up || e->key() == Qt::Key_Down))) {
            e->ignore();
            return;
        }
#endif
        QWidget *pw = parentWidget();
        if (d->autoExclusive
#if QT_CONFIG(buttongroup)
        || d->group
#endif
#if QT_CONFIG(itemviews)
        || (pw && qobject_cast<QAbstractItemView *>(pw->parentWidget()))
#endif
        ) {
            // ### Using qobject_cast to check if the parent is a viewport of
            // QAbstractItemView is a crude hack, and should be revisited and
            // cleaned up when fixing task 194373. It's here to ensure that we
            // keep compatibility outside QAbstractItemView.
            d->moveFocus(e->key());
            if (hasFocus()) // nothing happened, propagate
                e->ignore();
        } else {
            // Prefer parent widget, use this if parent is absent
            QWidget *w = pw ? pw : this;
            bool reverse = (w->layoutDirection() == Qt::RightToLeft);
            if ((e->key() == Qt::Key_Left && !reverse)
                || (e->key() == Qt::Key_Right && reverse)) {
                next = false;
            }
            focusNextPrevChild(next);
        }
        break;
    }
    default:
#ifndef QT_NO_SHORTCUT
        if (e->matches(QKeySequence::Cancel) && d->down) {
            setDown(false);
            repaint();
            d->emitReleased();
            return;
        }
#endif
        e->ignore();
    }